

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

void __thiscall hgdb::json::Module::serialize_(Module *this,JSONWriter *w)

{
  pointer pcVar1;
  ulong __val;
  bool bVar2;
  char cVar3;
  JSONWriter *pJVar4;
  variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_> *pvVar5;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *this_00;
  ulong uVar6;
  char cVar7;
  pointer ppVar8;
  pointer __v;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ostream *local_78;
  Module *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  JSONWriter *local_40;
  char local_31;
  
  name._M_str = "name";
  name._M_len = 4;
  local_40 = w;
  pJVar4 = JSONWriter::key(w,name);
  pcVar1 = (this->name_)._M_dataplus._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar1,pcVar1 + (this->name_)._M_string_length);
  JSONWriter::value<std::__cxx11::string>(pJVar4,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  name_00._M_str = "instances";
  name_00._M_len = 9;
  pJVar4 = JSONWriter::key(local_40,name_00);
  local_31 = '[';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pJVar4->s_).field_0x10,&local_31,1);
  ppVar8 = (this->instances_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->instances_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = this;
  if (ppVar8 != local_48) {
    local_78 = (ostream *)&(local_40->s_).field_0x10;
    do {
      local_31 = '{';
      std::__ostream_insert<char,std::char_traits<char>>(local_78,&local_31,1);
      name_01._M_str = "name";
      name_01._M_len = 4;
      pJVar4 = JSONWriter::key(local_40,name_01);
      pcVar1 = (ppVar8->first)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar1,pcVar1 + (ppVar8->first)._M_string_length);
      pJVar4 = JSONWriter::value<std::__cxx11::string>(pJVar4,&local_b8);
      name_02._M_str = "module";
      name_02._M_len = 6;
      pJVar4 = JSONWriter::key(pJVar4,name_02);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar1 = (ppVar8->second->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + (ppVar8->second->name_)._M_string_length);
      pJVar4 = JSONWriter::value<std::__cxx11::string>(pJVar4,&local_68);
      JSONWriter::end_obj(pJVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != local_48);
  }
  pJVar4 = local_40;
  JSONWriter::end_array(local_40);
  name_03._M_str = "variables";
  name_03._M_len = 9;
  pJVar4 = JSONWriter::key(pJVar4,name_03);
  local_31 = '[';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(pJVar4->s_).field_0x10,&local_31,1);
  __v = (local_70->variables_).
        super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (pointer)(local_70->variables_).
                      super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)__v != local_48) {
    do {
      if ((__v->super__Variant_base<hgdb::json::Variable,_unsigned_long>).
          super__Move_assign_alias<hgdb::json::Variable,_unsigned_long>.
          super__Copy_assign_alias<hgdb::json::Variable,_unsigned_long>.
          super__Move_ctor_alias<hgdb::json::Variable,_unsigned_long>.
          super__Copy_ctor_alias<hgdb::json::Variable,_unsigned_long>.
          super__Variant_storage_alias<hgdb::json::Variable,_unsigned_long>._M_index == '\0') {
        this_00 = std::get<0ul,hgdb::json::Variable,unsigned_long>(__v);
        Variable::serialize(this_00,local_40);
      }
      else {
        pvVar5 = std::get<1ul,hgdb::json::Variable,unsigned_long>(__v);
        __val = *pvVar5;
        cVar7 = '\x01';
        if (9 < __val) {
          uVar6 = __val;
          cVar3 = '\x04';
          do {
            cVar7 = cVar3;
            if (uVar6 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_001f6b7c;
            }
            if (uVar6 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_001f6b7c;
            }
            if (uVar6 < 10000) goto LAB_001f6b7c;
            bVar2 = 99999 < uVar6;
            uVar6 = uVar6 / 10000;
            cVar3 = cVar7 + '\x04';
          } while (bVar2);
          cVar7 = cVar7 + '\x01';
        }
LAB_001f6b7c:
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar7);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_98._M_dataplus._M_p,(uint)local_98._M_string_length,__val);
        JSONWriter::value<std::__cxx11::string>(local_40,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      __v = __v + 1;
    } while ((pointer)__v != local_48);
  }
  JSONWriter::end_array(local_40);
  return;
}

Assistant:

void serialize_(JSONWriter &w) const override {
        w.key("name").value(name_);
        w.key("instances").begin_array();
        for (auto const &[name, m] : instances_) {
            w.begin_obj().key("name").value(name).key("module").value(m->name_).end_obj();
        }
        w.end_array();
        w.key("variables").begin_array();
        for (auto const &v : variables_) {
            if (v.index() == 0) {
                std::get<0>(v).serialize(w);
            } else {
                w.value(std::to_string(std::get<1>(v)));
            }
        }
        w.end_array();
    }